

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kexinit(LIBSSH2_SESSION *session)

{
  int iVar1;
  LIBSSH2_HOSTKEY_METHOD **ppLVar2;
  LIBSSH2_CRYPT_METHOD **ppLVar3;
  LIBSSH2_MAC_METHOD **ppLVar4;
  LIBSSH2_COMP_METHOD **ppLVar5;
  size_t sVar6;
  size_t local_d8;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  size_t local_90;
  uchar *puStack_80;
  int rc;
  uchar *s;
  uchar *data;
  size_t lang_sc_len;
  size_t lang_cs_len;
  size_t mac_sc_len;
  size_t mac_cs_len;
  size_t comp_sc_len;
  size_t comp_cs_len;
  size_t crypt_sc_len;
  size_t crypt_cs_len;
  size_t hostkey_len;
  size_t kex_len;
  size_t data_len;
  LIBSSH2_SESSION *session_local;
  
  if (session->kexinit_state == libssh2_NB_state_idle) {
    if (session->kex_prefs == (char *)0x0) {
      local_90 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)libssh2_kex_methods);
    }
    else {
      local_90 = strlen(session->kex_prefs);
    }
    if (session->hostkey_prefs == (char *)0x0) {
      ppLVar2 = libssh2_hostkey_methods();
      local_98 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar2);
    }
    else {
      local_98 = strlen(session->hostkey_prefs);
    }
    if ((session->local).crypt_prefs == (char *)0x0) {
      ppLVar3 = libssh2_crypt_methods();
      local_a0 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar3);
    }
    else {
      local_a0 = strlen((session->local).crypt_prefs);
    }
    if ((session->remote).crypt_prefs == (char *)0x0) {
      ppLVar3 = libssh2_crypt_methods();
      local_a8 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar3);
    }
    else {
      local_a8 = strlen((session->remote).crypt_prefs);
    }
    if ((session->local).mac_prefs == (char *)0x0) {
      ppLVar4 = _libssh2_mac_methods();
      local_b0 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar4);
    }
    else {
      local_b0 = strlen((session->local).mac_prefs);
    }
    if ((session->remote).mac_prefs == (char *)0x0) {
      ppLVar4 = _libssh2_mac_methods();
      local_b8 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar4);
    }
    else {
      local_b8 = strlen((session->remote).mac_prefs);
    }
    if ((session->local).comp_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_comp_methods(session);
      local_c0 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar5);
    }
    else {
      local_c0 = strlen((session->local).comp_prefs);
    }
    if ((session->remote).comp_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_comp_methods(session);
      local_c8 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar5);
    }
    else {
      local_c8 = strlen((session->remote).comp_prefs);
    }
    if ((session->local).lang_prefs == (char *)0x0) {
      local_d0 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)0x0);
    }
    else {
      local_d0 = strlen((session->local).lang_prefs);
    }
    if ((session->remote).lang_prefs == (char *)0x0) {
      local_d8 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)0x0);
    }
    else {
      local_d8 = strlen((session->remote).lang_prefs);
    }
    kex_len = local_90 + local_98 + local_a0 + local_a8 + local_c0 + local_c8 + local_b0 + local_b8
              + local_d0 + local_d8 + 0x3e;
    s = (uchar *)(*session->alloc)(kex_len,&session->abstract);
    if (s == (uchar *)0x0) {
      iVar1 = _libssh2_error(session,-6,"Unable to allocate memory");
      return iVar1;
    }
    *s = '\x14';
    RAND_bytes(s + 1,0x10);
    puStack_80 = s + 0x11;
    if (session->kex_prefs == (char *)0x0) {
      sVar6 = kex_method_list(puStack_80,local_90,(LIBSSH2_COMMON_METHOD **)libssh2_kex_methods);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_90);
      memcpy(s + 0x15,session->kex_prefs,local_90);
      puStack_80 = s + 0x15 + local_90;
    }
    if (session->hostkey_prefs == (char *)0x0) {
      ppLVar2 = libssh2_hostkey_methods();
      sVar6 = kex_method_list(puStack_80,local_98,(LIBSSH2_COMMON_METHOD **)ppLVar2);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_98);
      memcpy(puStack_80 + 4,session->hostkey_prefs,local_98);
      puStack_80 = puStack_80 + 4 + local_98;
    }
    if ((session->local).crypt_prefs == (char *)0x0) {
      ppLVar3 = libssh2_crypt_methods();
      sVar6 = kex_method_list(puStack_80,local_a0,(LIBSSH2_COMMON_METHOD **)ppLVar3);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_a0);
      memcpy(puStack_80 + 4,(session->local).crypt_prefs,local_a0);
      puStack_80 = puStack_80 + 4 + local_a0;
    }
    if ((session->remote).crypt_prefs == (char *)0x0) {
      ppLVar3 = libssh2_crypt_methods();
      sVar6 = kex_method_list(puStack_80,local_a8,(LIBSSH2_COMMON_METHOD **)ppLVar3);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_a8);
      memcpy(puStack_80 + 4,(session->remote).crypt_prefs,local_a8);
      puStack_80 = puStack_80 + 4 + local_a8;
    }
    if ((session->local).mac_prefs == (char *)0x0) {
      ppLVar4 = _libssh2_mac_methods();
      sVar6 = kex_method_list(puStack_80,local_b0,(LIBSSH2_COMMON_METHOD **)ppLVar4);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_b0);
      memcpy(puStack_80 + 4,(session->local).mac_prefs,local_b0);
      puStack_80 = puStack_80 + 4 + local_b0;
    }
    if ((session->remote).mac_prefs == (char *)0x0) {
      ppLVar4 = _libssh2_mac_methods();
      sVar6 = kex_method_list(puStack_80,local_b8,(LIBSSH2_COMMON_METHOD **)ppLVar4);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_b8);
      memcpy(puStack_80 + 4,(session->remote).mac_prefs,local_b8);
      puStack_80 = puStack_80 + 4 + local_b8;
    }
    if ((session->local).comp_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_comp_methods(session);
      sVar6 = kex_method_list(puStack_80,local_c0,(LIBSSH2_COMMON_METHOD **)ppLVar5);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_c0);
      memcpy(puStack_80 + 4,(session->local).comp_prefs,local_c0);
      puStack_80 = puStack_80 + 4 + local_c0;
    }
    if ((session->remote).comp_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_comp_methods(session);
      sVar6 = kex_method_list(puStack_80,local_c8,(LIBSSH2_COMMON_METHOD **)ppLVar5);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_c8);
      memcpy(puStack_80 + 4,(session->remote).comp_prefs,local_c8);
      puStack_80 = puStack_80 + 4 + local_c8;
    }
    if ((session->local).lang_prefs == (char *)0x0) {
      sVar6 = kex_method_list(puStack_80,local_d0,(LIBSSH2_COMMON_METHOD **)0x0);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_d0);
      memcpy(puStack_80 + 4,(session->local).lang_prefs,local_d0);
      puStack_80 = puStack_80 + 4 + local_d0;
    }
    if ((session->remote).lang_prefs == (char *)0x0) {
      sVar6 = kex_method_list(puStack_80,local_d8,(LIBSSH2_COMMON_METHOD **)0x0);
      puStack_80 = puStack_80 + sVar6;
    }
    else {
      _libssh2_htonu32(puStack_80,(uint32_t)local_d8);
      memcpy(puStack_80 + 4,(session->remote).lang_prefs,local_d8);
      puStack_80 = puStack_80 + 4 + local_d8;
    }
    *puStack_80 = '\0';
    _libssh2_htonu32(puStack_80 + 1,0);
    session->kexinit_state = libssh2_NB_state_created;
  }
  else {
    s = session->kexinit_data;
    kex_len = session->kexinit_data_len;
    session->kexinit_data = (uchar *)0x0;
    session->kexinit_data_len = 0;
  }
  iVar1 = _libssh2_transport_send(session,s,kex_len,(uchar *)0x0,0);
  if (iVar1 == -0x25) {
    session->kexinit_data = s;
    session->kexinit_data_len = kex_len;
    session_local._4_4_ = -0x25;
  }
  else if (iVar1 == 0) {
    if ((session->local).kexinit != (uchar *)0x0) {
      (*session->free)((session->local).kexinit,&session->abstract);
    }
    (session->local).kexinit = s;
    (session->local).kexinit_len = kex_len;
    session->kexinit_state = libssh2_NB_state_idle;
    session_local._4_4_ = 0;
  }
  else {
    (*session->free)(s,&session->abstract);
    session->kexinit_state = libssh2_NB_state_idle;
    session_local._4_4_ =
         _libssh2_error(session,iVar1,"Unable to send KEXINIT packet to remote host");
  }
  return session_local._4_4_;
}

Assistant:

static int kexinit(LIBSSH2_SESSION * session)
{
    /* 62 = packet_type(1) + cookie(16) + first_packet_follows(1) +
       reserved(4) + length longs(40) */
    size_t data_len = 62;
    size_t kex_len, hostkey_len = 0;
    size_t crypt_cs_len, crypt_sc_len;
    size_t comp_cs_len, comp_sc_len;
    size_t mac_cs_len, mac_sc_len;
    size_t lang_cs_len, lang_sc_len;
    unsigned char *data, *s;
    int rc;

    if (session->kexinit_state == libssh2_NB_state_idle) {
        kex_len =
            LIBSSH2_METHOD_PREFS_LEN(session->kex_prefs, libssh2_kex_methods);
        hostkey_len =
            LIBSSH2_METHOD_PREFS_LEN(session->hostkey_prefs,
                                     libssh2_hostkey_methods());
        crypt_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.crypt_prefs,
                                     libssh2_crypt_methods());
        crypt_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.crypt_prefs,
                                     libssh2_crypt_methods());
        mac_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.mac_prefs,
                                     _libssh2_mac_methods());
        mac_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.mac_prefs,
                                     _libssh2_mac_methods());
        comp_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.comp_prefs,
                                     _libssh2_comp_methods(session));
        comp_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.comp_prefs,
                                     _libssh2_comp_methods(session));
        lang_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.lang_prefs, NULL);
        lang_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.lang_prefs, NULL);

        data_len += kex_len + hostkey_len + crypt_cs_len + crypt_sc_len +
            comp_cs_len + comp_sc_len + mac_cs_len + mac_sc_len +
            lang_cs_len + lang_sc_len;

        s = data = LIBSSH2_ALLOC(session, data_len);
        if (!data) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory");
        }

        *(s++) = SSH_MSG_KEXINIT;

        _libssh2_random(s, 16);
        s += 16;

        /* Ennumerating through these lists twice is probably (certainly?)
           inefficient from a CPU standpoint, but it saves multiple
           malloc/realloc calls */
        LIBSSH2_METHOD_PREFS_STR(s, kex_len, session->kex_prefs,
                                 libssh2_kex_methods);
        LIBSSH2_METHOD_PREFS_STR(s, hostkey_len, session->hostkey_prefs,
                                 libssh2_hostkey_methods());
        LIBSSH2_METHOD_PREFS_STR(s, crypt_cs_len, session->local.crypt_prefs,
                                 libssh2_crypt_methods());
        LIBSSH2_METHOD_PREFS_STR(s, crypt_sc_len, session->remote.crypt_prefs,
                                 libssh2_crypt_methods());
        LIBSSH2_METHOD_PREFS_STR(s, mac_cs_len, session->local.mac_prefs,
                                 _libssh2_mac_methods());
        LIBSSH2_METHOD_PREFS_STR(s, mac_sc_len, session->remote.mac_prefs,
                                 _libssh2_mac_methods());
        LIBSSH2_METHOD_PREFS_STR(s, comp_cs_len, session->local.comp_prefs,
                                 _libssh2_comp_methods(session));
        LIBSSH2_METHOD_PREFS_STR(s, comp_sc_len, session->remote.comp_prefs,
                                 _libssh2_comp_methods(session));
        LIBSSH2_METHOD_PREFS_STR(s, lang_cs_len, session->local.lang_prefs,
                                 NULL);
        LIBSSH2_METHOD_PREFS_STR(s, lang_sc_len, session->remote.lang_prefs,
                                 NULL);

        /* No optimistic KEX packet follows */
        /* Deal with optimistic packets
         * session->flags |= KEXINIT_OPTIMISTIC
         * session->flags |= KEXINIT_METHODSMATCH
         */
        *(s++) = 0;

        /* Reserved == 0 */
        _libssh2_htonu32(s, 0);

#ifdef LIBSSH2DEBUG
        {
            /* Funnily enough, they'll all "appear" to be '\0' terminated */
            unsigned char *p = data + 21;       /* type(1) + cookie(16) + len(4) */

            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent KEX: %s", p);
            p += kex_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent HOSTKEY: %s", p);
            p += hostkey_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent CRYPT_CS: %s", p);
            p += crypt_cs_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent CRYPT_SC: %s", p);
            p += crypt_sc_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent MAC_CS: %s", p);
            p += mac_cs_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent MAC_SC: %s", p);
            p += mac_sc_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent COMP_CS: %s", p);
            p += comp_cs_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent COMP_SC: %s", p);
            p += comp_sc_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent LANG_CS: %s", p);
            p += lang_cs_len + 4;
            _libssh2_debug(session, LIBSSH2_TRACE_KEX, "Sent LANG_SC: %s", p);
            p += lang_sc_len + 4;
        }
#endif /* LIBSSH2DEBUG */

        session->kexinit_state = libssh2_NB_state_created;
    } else {
        data = session->kexinit_data;
        data_len = session->kexinit_data_len;
        /* zap the variables to ensure there is NOT a double free later */
        session->kexinit_data = NULL;
        session->kexinit_data_len = 0;
    }

    rc = _libssh2_transport_send(session, data, data_len, NULL, 0);
    if (rc == LIBSSH2_ERROR_EAGAIN) {
        session->kexinit_data = data;
        session->kexinit_data_len = data_len;
        return rc;
    }
    else if (rc) {
        LIBSSH2_FREE(session, data);
        session->kexinit_state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc,
                              "Unable to send KEXINIT packet to remote host");

    }

    if (session->local.kexinit) {
        LIBSSH2_FREE(session, session->local.kexinit);
    }

    session->local.kexinit = data;
    session->local.kexinit_len = data_len;

    session->kexinit_state = libssh2_NB_state_idle;

    return 0;
}